

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O3

N_Vector N_VCloneEmpty(N_Vector w)

{
  N_Vector p_Var1;
  
  p_Var1 = (*w->ops->nvcloneempty)(w);
  p_Var1->sunctx = w->sunctx;
  return p_Var1;
}

Assistant:

N_Vector N_VCloneEmpty(N_Vector w)
{
  N_Vector result;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(w));
  result = w->ops->nvcloneempty(w);
  result->sunctx = w->sunctx;
  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(w));
  return result;
}